

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O2

void __thiscall discordpp::Team::~Team(Team *this)

{
  std::unique_ptr<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>::~unique_ptr
            (&(this->owner_user_id).t_);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&(this->name).t_);
  std::
  unique_ptr<std::vector<discordpp::TeamMember,_std::allocator<discordpp::TeamMember>_>,_std::default_delete<std::vector<discordpp::TeamMember,_std::allocator<discordpp::TeamMember>_>_>_>
  ::~unique_ptr(&(this->members).t_);
  std::unique_ptr<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>::~unique_ptr
            (&(this->id).t_);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&(this->icon).
                 super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .t_);
  return;
}

Assistant:

Team(
        nullable_field<std::string> icon = uninitialized,
        field<Snowflake> id = uninitialized,
        field<std::vector<TeamMember> > members = uninitialized,
        field<std::string> name = uninitialized,
        field<Snowflake> owner_user_id = uninitialized
    ):
        icon(icon),
        id(id),
        members(members),
        name(name),
        owner_user_id(owner_user_id)
    {}